

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::AddEvent(CInput *this,char *pText,int Key,int Flags)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x10) != 0x20) {
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RDI + 0x10) * 0x90 + 0x18) = in_EDX;
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RDI + 0x10) * 0x90 + 0x14) = in_ECX;
    if (in_RSI == 0) {
      in_RDI[(long)*(int *)(in_RDI + 0x10) * 0x90 + 0x1c] = '\0';
    }
    else {
      str_copy(in_RDI,in_stack_ffffffffffffffd8,0);
    }
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RDI + 0x10) * 0x90 + 0xa0) =
         *(undefined4 *)(in_RDI + 0x1ca0);
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  }
  return;
}

Assistant:

void CInput::AddEvent(char *pText, int Key, int Flags)
{
	if(m_NumEvents != INPUT_BUFFER_SIZE)
	{
		m_aInputEvents[m_NumEvents].m_Key = Key;
		m_aInputEvents[m_NumEvents].m_Flags = Flags;
		if(!pText)
			m_aInputEvents[m_NumEvents].m_aText[0] = 0;
		else
			str_copy(m_aInputEvents[m_NumEvents].m_aText, pText, sizeof(m_aInputEvents[m_NumEvents].m_aText));
		m_aInputEvents[m_NumEvents].m_InputCount = m_InputCounter;
		m_NumEvents++;
	}
}